

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

GenericFunctionInstanceTypeResponse * __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::find(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
       *this,GenericFunctionInstanceTypeRequest *key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Node *this_00;
  GenericFunctionInstanceTypeRequest local_68;
  
  uVar2 = this->bucketCount;
  uVar3 = uVar2 - 1;
  uVar5 = key->hash;
  uVar4 = 0;
  while( true ) {
    if (uVar2 <= uVar4) {
      return (GenericFunctionInstanceTypeResponse *)0x0;
    }
    uVar5 = uVar5 & uVar3;
    this_00 = this->data + uVar5;
    local_68.hash = 0;
    local_68.aliases.head = (MatchData *)0x0;
    local_68.aliases.tail = (MatchData *)0x0;
    local_68.arguments.head = (TypeHandle *)0x0;
    local_68.arguments.tail = (TypeHandle *)0x0;
    local_68.parentType = (TypeBase *)0x0;
    local_68.function = (FunctionData *)0x0;
    bVar1 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
    if (bVar1) break;
    bVar1 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
    if (bVar1) {
      return &this_00->value;
    }
    uVar5 = uVar5 + uVar4 + 1;
    uVar4 = uVar4 + 1;
    uVar2 = this->bucketCount;
  }
  return (GenericFunctionInstanceTypeResponse *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}